

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void __thiscall diy::Bounds<int>::Bounds(Bounds<int> *this,int dim)

{
  DynamicPoint<int,_4UL>::DynamicPoint(&this->min,(long)dim,0);
  DynamicPoint<int,_4UL>::DynamicPoint(&this->max,(long)dim,0);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}